

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::StaticAssertion::StaticAssertion
          (StaticAssertion *this,Context *c,Expression *failureCondition,string *error)

{
  Expression::Expression(&this->super_Expression,StaticAssertion,c,unknown);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StaticAssertion_0032f3e0;
  (this->condition).object = failureCondition;
  std::__cxx11::string::string((string *)&this->errorMessage,(string *)error);
  if ((this->errorMessage)._M_string_length == 0) {
    std::__cxx11::string::assign((char *)&this->errorMessage);
  }
  if ((((this->condition).object)->kind & ~unknown) == value) {
    return;
  }
  throwInternalCompilerError("isPossiblyValue (condition.get())","StaticAssertion",0xa38);
}

Assistant:

StaticAssertion (const Context& c, Expression& failureCondition, std::string error)
            : Expression (ObjectType::StaticAssertion, c, ExpressionKind::unknown),
              condition (failureCondition), errorMessage (std::move (error))
        {
            if (errorMessage.empty())
                errorMessage = "static_assert failed";

            SOUL_ASSERT (isPossiblyValue (condition.get()));
        }